

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat0.c
# Opt level: O2

ggml_tensor * get_random_tensor(ggml_context *ctx0,int ndims,int64_t *ne,float fmin,float fmax)

{
  undefined1 auVar1 [16];
  ggml_tensor *pgVar2;
  int64_t iVar3;
  long lVar4;
  int i1;
  long lVar5;
  long lVar6;
  long lVar7;
  int i0;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  pgVar2 = (ggml_tensor *)ggml_new_tensor(ctx0,0,ndims,ne);
  switch(ndims) {
  case 1:
    for (lVar8 = 0; lVar8 < *ne; lVar8 = lVar8 + 1) {
      auVar10._0_4_ = frand();
      auVar10._4_60_ = extraout_var;
      auVar1 = vfmadd213ss_fma(auVar10._0_16_,ZEXT416((uint)(fmax - fmin)),ZEXT416((uint)fmin));
      *(int *)((long)pgVar2->data + lVar8 * 4) = auVar1._0_4_;
    }
    break;
  case 2:
    lVar9 = 0;
    for (lVar8 = 0; lVar8 < ne[1]; lVar8 = lVar8 + 1) {
      lVar5 = *ne;
      for (lVar7 = 0; lVar7 < lVar5; lVar7 = lVar7 + 1) {
        auVar13._0_4_ = frand();
        auVar13._4_60_ = extraout_var_02;
        auVar1 = vfmadd213ss_fma(auVar13._0_16_,ZEXT416((uint)(fmax - fmin)),ZEXT416((uint)fmin));
        lVar5 = *ne;
        *(int *)((long)pgVar2->data + lVar7 * 4 + lVar9 * lVar5) = auVar1._0_4_;
      }
      lVar9 = lVar9 + 4;
    }
    break;
  case 3:
    for (lVar8 = 0; lVar8 < ne[2]; lVar8 = lVar8 + 1) {
      lVar9 = ne[1];
      for (lVar5 = 0; lVar5 < lVar9; lVar5 = lVar5 + 1) {
        lVar7 = *ne;
        for (lVar6 = 0; lVar6 < lVar7; lVar6 = lVar6 + 1) {
          auVar11._0_4_ = frand();
          auVar11._4_60_ = extraout_var_00;
          auVar1 = vfmadd213ss_fma(auVar11._0_16_,ZEXT416((uint)(fmax - fmin)),ZEXT416((uint)fmin));
          lVar7 = *ne;
          lVar9 = ne[1];
          *(int *)((long)pgVar2->data + lVar6 * 4 + (lVar8 * lVar9 + lVar5) * lVar7 * 4) =
               auVar1._0_4_;
        }
      }
    }
    break;
  case 4:
    for (lVar8 = 0; lVar8 < ne[3]; lVar8 = lVar8 + 1) {
      lVar9 = ne[2];
      for (lVar5 = 0; lVar5 < lVar9; lVar5 = lVar5 + 1) {
        lVar7 = ne[1];
        for (lVar6 = 0; lVar6 < lVar7; lVar6 = lVar6 + 1) {
          iVar3 = *ne;
          for (lVar4 = 0; lVar4 < iVar3; lVar4 = lVar4 + 1) {
            auVar12._0_4_ = frand();
            auVar12._4_60_ = extraout_var_01;
            auVar1 = vfmadd213ss_fma(auVar12._0_16_,ZEXT416((uint)(fmax - fmin)),ZEXT416((uint)fmin)
                                    );
            lVar9 = ne[2];
            iVar3 = *ne;
            lVar7 = ne[1];
            *(int *)((long)pgVar2->data +
                    lVar4 * 4 + ((lVar8 * lVar9 + lVar5) * lVar7 + lVar6) * iVar3 * 4) =
                 auVar1._0_4_;
          }
        }
      }
    }
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                  ,0x4b,
                  "struct ggml_tensor *get_random_tensor(struct ggml_context *, int, int64_t *, float, float)"
                 );
  }
  return pgVar2;
}

Assistant:

struct ggml_tensor * get_random_tensor(
        struct ggml_context * ctx0,
        int ndims,
        int64_t ne[],
        float fmin,
        float fmax) {
    struct ggml_tensor * result = ggml_new_tensor(ctx0, GGML_TYPE_F32, ndims, ne);

    switch (ndims) {
        case 1:
            for (int i0 = 0; i0 < ne[0]; i0++) {
                ((float *)result->data)[i0] = frand()*(fmax - fmin) + fmin;
            }
            break;
        case 2:
            for (int i1 = 0; i1 < ne[1]; i1++) {
                for (int i0 = 0; i0 < ne[0]; i0++) {
                    ((float *)result->data)[i1*ne[0] + i0] = frand()*(fmax - fmin) + fmin;
                }
            }
            break;
        case 3:
            for (int i2 = 0; i2 < ne[2]; i2++) {
                for (int i1 = 0; i1 < ne[1]; i1++) {
                    for (int i0 = 0; i0 < ne[0]; i0++) {
                        ((float *)result->data)[i2*ne[1]*ne[0] + i1*ne[0] + i0] = frand()*(fmax - fmin) + fmin;
                    }
                }
            }
            break;
        case 4:
            for (int i3 = 0; i3 < ne[3]; i3++) {
                for (int i2 = 0; i2 < ne[2]; i2++) {
                    for (int i1 = 0; i1 < ne[1]; i1++) {
                        for (int i0 = 0; i0 < ne[0]; i0++) {
                            ((float *)result->data)[i3*ne[2]*ne[1]*ne[0] + i2*ne[1]*ne[0] + i1*ne[0] + i0] = frand()*(fmax - fmin) + fmin;
                        }
                    }
                }
            }
            break;
        default:
            assert(false);
    };

    return result;
}